

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

double sptk::world::anon_unknown_2::SelectBestF0
                 (double current_f0,double past_f0,double **f0_candidates,int number_of_candidates,
                 int target_index,double allowed_range)

{
  double dVar1;
  int i;
  double current_error;
  double best_f0;
  double minimum_error;
  double reference_f0;
  double allowed_range_local;
  int target_index_local;
  int number_of_candidates_local;
  double **f0_candidates_local;
  double past_f0_local;
  double current_f0_local;
  double local_8;
  
  dVar1 = (current_f0 * 3.0 + -past_f0) / 2.0;
  minimum_error = ABS(dVar1 - (*f0_candidates)[target_index]);
  best_f0 = (*f0_candidates)[target_index];
  for (i = 1; i < number_of_candidates; i = i + 1) {
    if (ABS(dVar1 - f0_candidates[i][target_index]) < minimum_error) {
      best_f0 = f0_candidates[i][target_index];
      minimum_error = ABS(dVar1 - f0_candidates[i][target_index]);
    }
  }
  if (ABS(1.0 - best_f0 / dVar1) <= allowed_range) {
    local_8 = best_f0;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

static double SelectBestF0(double current_f0, double past_f0,
    const double * const * f0_candidates, int number_of_candidates,
    int target_index, double allowed_range) {
  double reference_f0 = (current_f0 * 3.0 - past_f0) / 2.0;

  double minimum_error = fabs(reference_f0 - f0_candidates[0][target_index]);
  double best_f0 = f0_candidates[0][target_index];

  double current_error;
  for (int i = 1; i < number_of_candidates; ++i) {
    current_error = fabs(reference_f0 - f0_candidates[i][target_index]);
    if (current_error < minimum_error) {
      minimum_error = current_error;
      best_f0 = f0_candidates[i][target_index];
    }
  }
  if (fabs(1.0 - best_f0 / reference_f0) > allowed_range)
    return 0.0;
  return best_f0;
}